

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

bool __thiscall
QListModel::moveRows
          (QListModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  QList<QListWidgetItem_*> *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int fromRow;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_58;
  bool local_39;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < in_EDX) {
    iVar3 = in_EDX + in_ECX + -1;
    iVar4 = (*(code *)(in_RDI->d).d[7].super_QArrayData.alloc)(in_RDI,in_RSI);
    if (((((iVar3 < iVar4) && (-1 < in_R9D)) &&
         (iVar4 = in_R9D, iVar5 = (*(code *)(in_RDI->d).d[7].super_QArrayData.alloc)(in_RDI,in_R8),
         iVar4 <= iVar5)) && ((in_EDX != in_R9D && (in_EDX != in_R9D + -1)))) &&
       ((0 < in_ECX &&
        ((bVar1 = QModelIndex::isValid
                            ((QModelIndex *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)), !bVar1
         && (bVar1 = QModelIndex::isValid
                               ((QModelIndex *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
            !bVar1)))))) {
      QModelIndex::QModelIndex((QModelIndex *)0x89add1);
      uVar6 = (in_EDX + in_ECX) - 1;
      QModelIndex::QModelIndex((QModelIndex *)0x89adf2);
      bVar2 = QAbstractItemModel::beginMoveRows
                        ((QModelIndex *)in_RDI,(int)local_20,in_EDX,(QModelIndex *)(ulong)uVar6,
                         (int)local_38);
      local_58 = in_ECX;
      if (((bVar2 ^ 0xff) & 1) == 0) {
        while (local_58 != 0) {
          QList<QListWidgetItem_*>::move(in_RDI,CONCAT44(iVar3,iVar4),CONCAT44(uVar6,in_EDX));
          local_58 = local_58 + -1;
        }
        QAbstractItemModel::endMoveRows();
        local_39 = true;
      }
      else {
        local_39 = false;
      }
      goto LAB_0089ae8d;
    }
  }
  local_39 = false;
LAB_0089ae8d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceRow < 0
        || sourceRow + count - 1 >= rowCount(sourceParent)
        || destinationChild < 0
        || destinationChild > rowCount(destinationParent)
        || sourceRow == destinationChild
        || sourceRow == destinationChild - 1
        || count <= 0
        || sourceParent.isValid()
        || destinationParent.isValid()) {
        return false;
    }
    if (!beginMoveRows(QModelIndex(), sourceRow, sourceRow + count - 1, QModelIndex(), destinationChild))
        return false;

    int fromRow = sourceRow;
    if (destinationChild < sourceRow)
        fromRow += count - 1;
    else
        destinationChild--;
    while (count--)
        items.move(fromRow, destinationChild);
    endMoveRows();
    return true;
}